

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qc_thread.c
# Opt level: O2

QcCondition * qc_thread_condition_create(void)

{
  int iVar1;
  pthread_cond_t *__cond;
  
  __cond = (pthread_cond_t *)calloc(1,0x30);
  if (__cond != (pthread_cond_t *)0x0) {
    iVar1 = pthread_cond_init(__cond,(pthread_condattr_t *)0x0);
    if (iVar1 != 0) {
      _qc_error("/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_thread.c"
                ,0x145,"thread cond create failed");
      free(__cond);
      __cond = (pthread_cond_t *)0x0;
    }
    return (QcCondition *)__cond;
  }
  fprintf(_stderr,"malloc failed. [%s  line:%d]\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_thread.c"
          ,0x13d);
  __assert_fail("cond",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_thread.c"
                ,0x13d,"QcCondition *qc_thread_condition_create()");
}

Assistant:

QcCondition* qc_thread_condition_create()
{
    QcCondition *cond;

    qc_malloc(cond, sizeof(QcCondition));
    if(NULL == cond)
    {
        return NULL;
    }

    if(0 != pthread_cond_init(&cond->cond_t, NULL))
    {
        qc_error("thread cond create failed");
        qc_free(cond);
        return NULL;
    }

    return cond;
}